

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O0

int __thiscall GdlPass::MachineClassKey(GdlPass *this,gid16 wGlyphID,int nPassID)

{
  bool bVar1;
  int iVar2;
  iterator this_00;
  ushort in_SI;
  long in_RDI;
  iterator itscs;
  int nKey;
  SourceClassSet *pscs;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  _Self local_28;
  int local_1c;
  long local_18;
  
  local_18 = in_RDI + 0x100 + (long)(int)(uint)in_SI * 0x30;
  local_1c = 0;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<GdlGlyphClassDefn_*,_std::less<GdlGlyphClassDefn_*>,_std::allocator<GdlGlyphClassDefn_*>_>
       ::begin((set<GdlGlyphClassDefn_*,_std::less<GdlGlyphClassDefn_*>,_std::allocator<GdlGlyphClassDefn_*>_>
                *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  while( true ) {
    this_00 = std::
              set<GdlGlyphClassDefn_*,_std::less<GdlGlyphClassDefn_*>,_std::allocator<GdlGlyphClassDefn_*>_>
              ::end((set<GdlGlyphClassDefn_*,_std::less<GdlGlyphClassDefn_*>,_std::allocator<GdlGlyphClassDefn_*>_>
                     *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<GdlGlyphClassDefn_*>::operator*
              ((_Rb_tree_const_iterator<GdlGlyphClassDefn_*> *)this_00._M_node);
    iVar2 = GdlGlyphClassDefn::FsmID((GdlGlyphClassDefn *)this_00._M_node,in_stack_ffffffffffffffcc)
    ;
    local_1c = iVar2 + local_1c;
    std::_Rb_tree_const_iterator<GdlGlyphClassDefn_*>::operator++
              ((_Rb_tree_const_iterator<GdlGlyphClassDefn_*> *)this_00._M_node);
  }
  return local_1c;
}

Assistant:

int GdlPass::MachineClassKey(gid16 wGlyphID, int nPassID)
{
	SourceClassSet * pscs = m_rgscsInclusions + wGlyphID;
	int nKey = 0;
	for (SourceClassSet::iterator itscs = pscs->begin();
		itscs != pscs->end();
		++itscs)
	{
		Assert((*itscs)->FsmID(nPassID) > -1);
		nKey += (*itscs)->FsmID(nPassID);
	}
	return nKey;
}